

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::dequantize_from_int32(Mat *src,Mat *dst,Mat *scale_data,Mat *bias_data,Option *opt)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Layer *pLVar7;
  long lVar8;
  ParamDict pd;
  ParamDict local_f0;
  Mat *local_e0;
  ModelBinFromMatArray local_d8;
  Mat local_c8;
  Mat MStack_80;
  
  local_e0 = dst;
  pLVar7 = create_layer(0x3a);
  ParamDict::ParamDict(&local_f0);
  ParamDict::set(&local_f0,0,scale_data->w);
  ParamDict::set(&local_f0,1,bias_data->w);
  (*pLVar7->_vptr_Layer[2])(pLVar7,&local_f0);
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  MStack_80.cstep = 0;
  MStack_80.allocator = (Allocator *)0x0;
  MStack_80.dims = 0;
  MStack_80.w = 0;
  MStack_80.h = 0;
  MStack_80.d = 0;
  MStack_80.c = 0;
  local_c8.cstep = 0;
  MStack_80.data = (void *)0x0;
  MStack_80.refcount = (int *)0x0;
  MStack_80.elemsize = 0;
  MStack_80.elempack = 0;
  if (&local_c8 != scale_data) {
    piVar1 = scale_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_c8.data = scale_data->data;
    local_c8.refcount._0_4_ = SUB84(scale_data->refcount,0);
    local_c8.refcount._4_4_ = (undefined4)((ulong)scale_data->refcount >> 0x20);
    local_c8.elemsize._0_4_ = (undefined4)scale_data->elemsize;
    local_c8.elemsize._4_4_ = (undefined4)(scale_data->elemsize >> 0x20);
    local_c8.elempack = scale_data->elempack;
    local_c8.allocator = scale_data->allocator;
    local_c8.dims = scale_data->dims;
    local_c8.w = scale_data->w;
    local_c8.h = scale_data->h;
    local_c8.d = scale_data->d;
    local_c8.c = scale_data->c;
    local_c8.cstep = scale_data->cstep;
  }
  if (&MStack_80 != bias_data) {
    piVar1 = bias_data->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    MStack_80.data = bias_data->data;
    MStack_80.refcount = bias_data->refcount;
    MStack_80.elemsize = bias_data->elemsize;
    MStack_80.elempack = bias_data->elempack;
    MStack_80.allocator = bias_data->allocator;
    uVar3 = bias_data->dims;
    uVar4 = bias_data->w;
    uVar5 = bias_data->h;
    uVar6 = bias_data->d;
    MStack_80.c = bias_data->c;
    MStack_80.cstep = bias_data->cstep;
    MStack_80.dims = uVar3;
    MStack_80.w = uVar4;
    MStack_80.h = uVar5;
    MStack_80.d = uVar6;
  }
  ModelBinFromMatArray::ModelBinFromMatArray(&local_d8,&local_c8);
  (*pLVar7->_vptr_Layer[3])(pLVar7,&local_d8);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_d8);
  (*pLVar7->_vptr_Layer[4])(pLVar7,opt);
  (*pLVar7->_vptr_Layer[7])(pLVar7,src,local_e0,opt);
  (*pLVar7->_vptr_Layer[5])(pLVar7,opt);
  (*pLVar7->_vptr_Layer[1])(pLVar7);
  lVar8 = 0x48;
  do {
    piVar1 = *(int **)((long)&local_c8.refcount + lVar8);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_c8.data + lVar8);
        plVar2 = *(long **)((long)&local_c8.allocator + lVar8);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_c8.cstep + lVar8) = 0;
    *(undefined8 *)((long)&local_c8.refcount + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_c8.elemsize + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_c8.data + lVar8) = 0;
    *(undefined8 *)((long)&local_c8.refcount + lVar8) = 0;
    *(undefined8 *)((long)&local_c8.dims + lVar8) = 0;
    *(undefined8 *)((long)&local_c8.h + lVar8) = 0;
    *(undefined4 *)((long)&local_c8.c + lVar8) = 0;
    lVar8 = lVar8 + -0x48;
  } while (lVar8 != -0x48);
  ParamDict::~ParamDict(&local_f0);
  return;
}

Assistant:

void dequantize_from_int32(const Mat& src, Mat& dst, const Mat& scale_data, const Mat& bias_data, const Option& opt)
{
    Layer* dequantize = create_layer(LayerType::Dequantize);

    ParamDict pd;
    pd.set(0, scale_data.w);
    pd.set(1, bias_data.w);

    dequantize->load_param(pd);

    Mat weights[2];
    weights[0] = scale_data;
    weights[1] = bias_data;

    dequantize->load_model(ModelBinFromMatArray(weights));

    dequantize->create_pipeline(opt);

    dequantize->forward(src, dst, opt);

    dequantize->destroy_pipeline(opt);

    delete dequantize;
}